

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::putBacktrackingBasis(HEkk *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x1c,0);
  lVar4 = (long)(this->lp_).num_row_;
  if (0 < lVar4) {
    piVar1 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar3[piVar1[lVar5]] = pdVar2[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x1c,0);
  putBacktrackingBasis(this,&(this->basis_).basicIndex_);
  return;
}

Assistant:

void HEkk::putBacktrackingBasis() {
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    scattered_dual_edge_weight_[basicIndex[i]] = dual_edge_weight_[i];
  analysis_.simplexTimerStop(PermWtClock);
  putBacktrackingBasis(basicIndex);
}